

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtfmtsym.cpp
# Opt level: O3

void __thiscall
icu_63::DateFormatSymbols::setMonths
          (DateFormatSymbols *this,UnicodeString *monthsArray,int32_t count)

{
  long *plVar1;
  uint uVar2;
  long lVar3;
  UnicodeString *p;
  UMemory *this_00;
  UnicodeString *pUVar4;
  long lVar5;
  
  pUVar4 = this->fMonths;
  p = monthsArray;
  if (pUVar4 != (UnicodeString *)0x0) {
    lVar3 = *(long *)((long)&pUVar4[-1].fUnion + 0x30);
    if (lVar3 != 0) {
      lVar3 = lVar3 << 6;
      do {
        icu_63::UnicodeString::~UnicodeString
                  ((UnicodeString *)
                   ((long)&pUVar4[-1].super_Replaceable.super_UObject._vptr_UObject + lVar3));
        lVar3 = lVar3 + -0x40;
      } while (lVar3 != 0);
    }
    UMemory::operator_delete__((UMemory *)((long)&pUVar4[-1].fUnion + 0x30),p);
  }
  lVar5 = (long)(int)(count + (uint)(count == 0));
  lVar3 = lVar5 * 0x40;
  this_00 = (UMemory *)0xffffffffffffffff;
  if (-1 < count) {
    this_00 = (UMemory *)(lVar3 + 8);
  }
  plVar1 = (long *)UMemory::operator_new__(this_00,(size_t)p);
  if (plVar1 == (long *)0x0) {
    pUVar4 = (UnicodeString *)0x0;
  }
  else {
    *plVar1 = lVar5;
    pUVar4 = (UnicodeString *)(plVar1 + 1);
    lVar5 = 0;
    do {
      *(undefined ***)((long)plVar1 + lVar5 + 8) = &PTR__UnicodeString_00487e70;
      *(undefined2 *)((long)plVar1 + lVar5 + 0x10) = 2;
      lVar5 = lVar5 + 0x40;
    } while (lVar3 != lVar5);
  }
  this->fMonths = pUVar4;
  if (0 < count) {
    uVar2 = count + 1;
    do {
      icu_63::UnicodeString::operator=(pUVar4,monthsArray);
      uVar2 = uVar2 - 1;
      pUVar4 = pUVar4 + 1;
      monthsArray = monthsArray + 1;
    } while (1 < uVar2);
  }
  this->fMonthsCount = count;
  return;
}

Assistant:

void
DateFormatSymbols::setMonths(const UnicodeString* monthsArray, int32_t count)
{
    // delete the old list if we own it
    if (fMonths)
        delete[] fMonths;

    // we always own the new list, which we create here (we duplicate rather
    // than adopting the list passed in)
    fMonths = newUnicodeStringArray(count);
    uprv_arrayCopy( monthsArray,fMonths,count);
    fMonthsCount = count;
}